

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this,cmTarget *target)

{
  cmSourceFile *this_00;
  char *pcVar1;
  Value *pVVar2;
  Value *pVVar3;
  ostream *poVar4;
  const_iterator cVar5;
  string *value;
  Value *this_01;
  pointer pbVar6;
  allocator local_6d1;
  cmTarget *local_6d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string file;
  string json_file;
  string dir;
  Value lj_root;
  Value local_5d0;
  Value local_5a8;
  Value local_580;
  Value local_558;
  Value local_530;
  Value local_508;
  string local_4e0;
  cmGeneratedFileStream json_fout;
  cmGeneratedFileStream fout;
  
  local_6d0 = target;
  cmTarget::GetSupportDirectory_abi_cxx11_(&dir,target);
  std::__cxx11::string::string((string *)&file,(string *)&dir);
  std::__cxx11::string::append((char *)&file);
  std::operator+(&json_file,&dir,"/Labels.json");
  std::__cxx11::string::string((string *)&fout,"LABELS",(allocator *)&json_fout);
  pcVar1 = cmTarget::GetProperty(local_6d0,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  if (pcVar1 == (char *)0x0) {
    cmsys::SystemTools::RemoveFile(&file);
    cmsys::SystemTools::RemoveFile(&json_file);
  }
  else {
    Json::Value::Value(&lj_root,objectValue);
    Json::Value::Value(&local_558,objectValue);
    pVVar2 = Json::Value::operator[](&lj_root,"target");
    pVVar2 = Json::Value::operator=(pVVar2,&local_558);
    Json::Value::~Value(&local_558);
    Json::Value::Value(&local_580,&local_6d0->Name);
    pVVar3 = Json::Value::operator[](pVVar2,"name");
    Json::Value::operator=(pVVar3,&local_580);
    Json::Value::~Value(&local_580);
    Json::Value::Value(&local_5a8,arrayValue);
    pVVar2 = Json::Value::operator[](pVVar2,"labels");
    pVVar2 = Json::Value::operator=(pVVar2,&local_5a8);
    Json::Value::~Value(&local_5a8);
    Json::Value::Value(&local_5d0,arrayValue);
    pVVar3 = Json::Value::operator[](&lj_root,"sources");
    pVVar3 = Json::Value::operator=(pVVar3,&local_5d0);
    Json::Value::~Value(&local_5d0);
    cmsys::SystemTools::MakeDirectory(dir._M_dataplus._M_p);
    cmGeneratedFileStream::cmGeneratedFileStream(&fout,file._M_dataplus._M_p,false);
    labels.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    labels.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    labels.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&json_fout,pcVar1,(allocator *)&sources);
    cmSystemTools::ExpandListArgument((string *)&json_fout,&labels,false);
    std::__cxx11::string::~string((string *)&json_fout);
    if (labels.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        labels.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::operator<<((ostream *)&fout,"# Target labels\n");
      for (pbVar6 = labels.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 != labels.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
        poVar4 = std::operator<<((ostream *)&fout," ");
        poVar4 = std::operator<<(poVar4,(string *)pbVar6);
        std::operator<<(poVar4,"\n");
        Json::Value::Value((Value *)&json_fout,pbVar6);
        Json::Value::append(pVVar2,(Value *)&json_fout);
        Json::Value::~Value((Value *)&json_fout);
      }
    }
    std::operator<<((ostream *)&fout,"# Source files and their labels\n");
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetConfigurations(&local_4e0,local_6d0->Makefile,&configs,true);
    std::__cxx11::string::~string((string *)&local_4e0);
    if (configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&json_fout,"",&local_6d1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&configs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&json_fout);
      std::__cxx11::string::~string((string *)&json_fout);
    }
    for (pbVar6 = configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      cmTarget::GetSourceFiles(local_6d0,&sources,pbVar6);
    }
    cVar5 = cmRemoveDuplicates<std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>(&sources);
    for (local_6d0 = (cmTarget *)
                     sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        local_6d0 != (cmTarget *)cVar5._M_current;
        local_6d0 = (cmTarget *)
                    &(local_6d0->Properties).
                     super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                     ._M_t._M_impl.super__Rb_tree_header) {
      Json::Value::Value((Value *)&json_fout,objectValue);
      pVVar2 = Json::Value::append(pVVar3,(Value *)&json_fout);
      Json::Value::~Value((Value *)&json_fout);
      this_00 = *(cmSourceFile **)
                 &(local_6d0->Properties).
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                  ._M_t._M_impl;
      value = cmSourceFile::GetFullPath(this_00,(string *)0x0);
      poVar4 = std::operator<<((ostream *)&fout,(string *)value);
      std::operator<<(poVar4,"\n");
      Json::Value::Value(&local_508,value);
      this_01 = Json::Value::operator[](pVVar2,"file");
      Json::Value::operator=(this_01,&local_508);
      Json::Value::~Value(&local_508);
      std::__cxx11::string::string((string *)&json_fout,"LABELS",&local_6d1);
      pcVar1 = cmSourceFile::GetProperty(this_00,(string *)&json_fout);
      std::__cxx11::string::~string((string *)&json_fout);
      if (pcVar1 != (char *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&labels);
        Json::Value::Value(&local_530,arrayValue);
        pVVar2 = Json::Value::operator[](pVVar2,"labels");
        pVVar2 = Json::Value::operator=(pVVar2,&local_530);
        Json::Value::~Value(&local_530);
        std::__cxx11::string::string((string *)&json_fout,pcVar1,&local_6d1);
        cmSystemTools::ExpandListArgument((string *)&json_fout,&labels,false);
        std::__cxx11::string::~string((string *)&json_fout);
        for (pbVar6 = labels.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar6 != labels.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
          poVar4 = std::operator<<((ostream *)&fout," ");
          poVar4 = std::operator<<(poVar4,(string *)pbVar6);
          std::operator<<(poVar4,"\n");
          Json::Value::Value((Value *)&json_fout,pbVar6);
          Json::Value::append(pVVar2,(Value *)&json_fout);
          Json::Value::~Value((Value *)&json_fout);
        }
      }
    }
    cmGeneratedFileStream::cmGeneratedFileStream(&json_fout,json_file._M_dataplus._M_p,false);
    Json::operator<<((ostream *)&json_fout,&lj_root);
    cmGeneratedFileStream::~cmGeneratedFileStream(&json_fout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configs);
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&labels);
    cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
    Json::Value::~Value(&lj_root);
  }
  std::__cxx11::string::~string((string *)&json_file);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary(cmTarget* target)
{
  // Place the labels file in a per-target support directory.
  std::string dir = target->GetSupportDirectory();
  std::string file = dir;
  file += "/Labels.txt";
  std::string json_file = dir + "/Labels.json";

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Check whether labels are enabled for this target.
  if(const char* value = target->GetProperty("LABELS"))
    {
    Json::Value lj_root(Json::objectValue);
    Json::Value& lj_target =
      lj_root["target"] = Json::objectValue;
    lj_target["name"] = target->GetName();
    Json::Value& lj_target_labels =
      lj_target["labels"] = Json::arrayValue;
    Json::Value& lj_sources =
      lj_root["sources"] = Json::arrayValue;

    cmSystemTools::MakeDirectory(dir.c_str());
    cmGeneratedFileStream fout(file.c_str());

    // List the target-wide labels.  All sources in the target get
    // these labels.
    std::vector<std::string> labels;
    cmSystemTools::ExpandListArgument(value, labels);
    if(!labels.empty())
      {
      fout << "# Target labels\n";
      for(std::vector<std::string>::const_iterator li = labels.begin();
          li != labels.end(); ++li)
        {
        fout << " " << *li << "\n";
        lj_target_labels.append(*li);
        }
      }

    // List the source files with any per-source labels.
    fout << "# Source files and their labels\n";
    std::vector<cmSourceFile*> sources;
    std::vector<std::string> configs;
    target->GetMakefile()->GetConfigurations(configs);
    if (configs.empty())
      {
      configs.push_back("");
      }
    for(std::vector<std::string>::const_iterator ci = configs.begin();
        ci != configs.end(); ++ci)
      {
      target->GetSourceFiles(sources, *ci);
      }
    std::vector<cmSourceFile*>::const_iterator sourcesEnd
        = cmRemoveDuplicates(sources);
    for(std::vector<cmSourceFile*>::const_iterator si = sources.begin();
        si != sourcesEnd; ++si)
      {
      Json::Value& lj_source = lj_sources.append(Json::objectValue);
      cmSourceFile* sf = *si;
      std::string const& sfp = sf->GetFullPath();
      fout << sfp << "\n";
      lj_source["file"] = sfp;
      if(const char* svalue = sf->GetProperty("LABELS"))
        {
        labels.clear();
        Json::Value& lj_source_labels =
          lj_source["labels"] = Json::arrayValue;
        cmSystemTools::ExpandListArgument(svalue, labels);
        for(std::vector<std::string>::const_iterator li = labels.begin();
            li != labels.end(); ++li)
          {
          fout << " " << *li << "\n";
          lj_source_labels.append(*li);
          }
        }
      }
    cmGeneratedFileStream json_fout(json_file.c_str());
    json_fout << lj_root;
    }
  else
#endif
    {
    cmSystemTools::RemoveFile(file);
    cmSystemTools::RemoveFile(json_file);
    }
}